

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

void __thiscall tinyusdz::usdc::USDCReader::Impl::PushWarn(Impl *this,string *s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *s_local;
  Impl *this_local;
  
  local_18 = s;
  s_local = (string *)this;
  ::std::operator+(&local_38,s);
  ::std::__cxx11::string::operator=((string *)&this->_warn,(string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void PushWarn(const std::string &s) { _warn = s + _warn; }